

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool anon_unknown.dwarf_42a79::UpdateOptionsFromCommandLine(Options *options,int argc,char **argv)

{
  uint uVar1;
  long lVar2;
  _Alloc_hider _Var3;
  char cVar4;
  char cVar5;
  int iVar6;
  ctype *pcVar7;
  invalid_argument *piVar8;
  Options *this;
  int iVar9;
  long *plVar10;
  size_type sVar11;
  size_type sVar12;
  bool bVar13;
  bool bVar14;
  string arg;
  string local_1e8;
  long *local_1c8;
  int local_1bc;
  string local_1b8;
  long *local_198;
  long *local_190;
  long *local_188;
  char **local_180;
  string local_178;
  Options *local_158;
  locale local_150 [8];
  locale local_148 [8];
  locale local_140 [8];
  locale local_138 [8];
  locale local_130 [8];
  locale local_128 [8];
  locale local_120 [8];
  locale local_118 [8];
  long *local_110;
  size_type local_108;
  long local_100 [2];
  long *local_f0;
  size_type local_e8;
  long local_e0 [2];
  long *local_d0;
  size_type local_c8;
  long local_c0 [2];
  long *local_b0;
  size_type local_a8;
  long local_a0 [2];
  long *local_90;
  size_type local_88;
  long local_80 [2];
  long *local_70;
  size_type local_68;
  long local_60 [2];
  Options *local_50;
  Options *local_48;
  Options *local_40;
  Options *local_38;
  
  local_1bc = argc;
  local_158 = options;
  if (1 < argc) {
    local_50 = (Options *)&options->AppSpace;
    local_48 = (Options *)&options->EnvironmentBlendMode;
    local_40 = (Options *)&options->ViewConfiguration;
    local_38 = (Options *)&options->FormFactor;
    plVar10 = (long *)0x1;
    local_180 = argv;
    do {
      local_198 = plVar10;
      std::__cxx11::string::string((string *)&local_1b8,argv[(int)plVar10],(allocator *)&local_1e8);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"--graphics","");
      std::locale::locale((locale *)&local_178);
      pcVar7 = std::use_facet<std::ctype<char>>((locale *)&local_178);
      sVar11 = local_1b8._M_string_length;
      _Var3._M_p = local_1e8._M_dataplus._M_p;
      if (local_1b8._M_string_length == local_1e8._M_string_length) {
        bVar13 = local_1b8._M_string_length == 0;
        if (!bVar13) {
          local_1c8 = (long *)local_1b8._M_dataplus._M_p;
          cVar5 = *local_1e8._M_dataplus._M_p;
          cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)*local_1b8._M_dataplus._M_p);
          cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
          if (cVar4 == cVar5) {
            sVar12 = 1;
            do {
              bVar13 = sVar11 == sVar12;
              if (bVar13) goto LAB_0010a7f0;
              cVar5 = _Var3._M_p[sVar12];
              cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))
                                (pcVar7,(int)*(char *)((long)local_1c8 + sVar12));
              cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
              sVar12 = sVar12 + 1;
            } while (cVar4 == cVar5);
          }
          goto LAB_0010a7ee;
        }
      }
      else {
LAB_0010a7ee:
        bVar13 = false;
      }
LAB_0010a7f0:
      bVar14 = true;
      if (!bVar13) {
        local_70 = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"-g","");
        std::locale::locale(local_118);
        pcVar7 = std::use_facet<std::ctype<char>>(local_118);
        sVar11 = local_1b8._M_string_length;
        if (local_1b8._M_string_length == local_68) {
          bVar14 = local_1b8._M_string_length == 0;
          if (bVar14) goto LAB_0010a8df;
          local_1c8 = (long *)local_1b8._M_dataplus._M_p;
          local_188 = local_70;
          lVar2 = *local_70;
          cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)*local_1b8._M_dataplus._M_p);
          cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)(char)lVar2);
          if (cVar5 == cVar4) {
            sVar12 = 1;
            do {
              bVar14 = sVar11 == sVar12;
              if (bVar14) goto LAB_0010a8df;
              cVar5 = *(char *)((long)local_188 + sVar12);
              cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))
                                (pcVar7,(int)*(char *)((long)local_1c8 + sVar12));
              cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
              sVar12 = sVar12 + 1;
            } while (cVar4 == cVar5);
          }
        }
        bVar14 = false;
      }
LAB_0010a8df:
      iVar9 = (int)local_198;
      if ((!bVar13) && (std::locale::~locale(local_118), local_70 != local_60)) {
        operator_delete(local_70,local_60[0] + 1);
      }
      std::locale::~locale((locale *)&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      argv = local_180;
      iVar6 = iVar9 + 1;
      if (bVar14) {
        if (local_1bc <= iVar6) {
          piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar8,"Argument parameter missing");
          __cxa_throw(piVar8,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        std::__cxx11::string::string((string *)&local_1e8,local_180[iVar6],(allocator *)&local_178);
        this = local_158;
LAB_0010b26a:
        std::__cxx11::string::operator=((string *)this,(string *)&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        uVar1 = iVar9 + 2;
      }
      else {
        local_188 = (long *)CONCAT44(local_188._4_4_,iVar6);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"--formfactor","");
        std::locale::locale((locale *)&local_178);
        pcVar7 = std::use_facet<std::ctype<char>>((locale *)&local_178);
        sVar11 = local_1b8._M_string_length;
        _Var3._M_p = local_1e8._M_dataplus._M_p;
        if (local_1b8._M_string_length == local_1e8._M_string_length) {
          bVar13 = local_1b8._M_string_length == 0;
          if (!bVar13) {
            local_1c8 = (long *)local_1b8._M_dataplus._M_p;
            cVar5 = *local_1e8._M_dataplus._M_p;
            cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)*local_1b8._M_dataplus._M_p);
            cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
            if (cVar4 == cVar5) {
              sVar12 = 1;
              do {
                bVar13 = sVar11 == sVar12;
                if (bVar13) goto LAB_0010aa32;
                cVar5 = _Var3._M_p[sVar12];
                cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))
                                  (pcVar7,(int)*(char *)((long)local_1c8 + sVar12));
                cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
                sVar12 = sVar12 + 1;
              } while (cVar4 == cVar5);
            }
            goto LAB_0010aa2f;
          }
        }
        else {
LAB_0010aa2f:
          bVar13 = false;
        }
LAB_0010aa32:
        bVar14 = true;
        if (!bVar13) {
          local_90 = local_80;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"-ff","");
          std::locale::locale(local_120);
          pcVar7 = std::use_facet<std::ctype<char>>(local_120);
          sVar11 = local_1b8._M_string_length;
          if (local_1b8._M_string_length == local_88) {
            bVar14 = local_1b8._M_string_length == 0;
            if (bVar14) goto LAB_0010ab1f;
            local_1c8 = (long *)local_1b8._M_dataplus._M_p;
            local_190 = local_90;
            lVar2 = *local_90;
            cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)*local_1b8._M_dataplus._M_p);
            cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)(char)lVar2);
            if (cVar5 == cVar4) {
              sVar12 = 1;
              do {
                bVar14 = sVar11 == sVar12;
                if (bVar14) goto LAB_0010ab1f;
                cVar5 = *(char *)((long)local_190 + sVar12);
                cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))
                                  (pcVar7,(int)*(char *)((long)local_1c8 + sVar12));
                cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
                sVar12 = sVar12 + 1;
              } while (cVar4 == cVar5);
            }
          }
          bVar14 = false;
        }
LAB_0010ab1f:
        iVar9 = (int)local_198;
        if ((!bVar13) && (std::locale::~locale(local_120), local_90 != local_80)) {
          operator_delete(local_90,local_80[0] + 1);
        }
        std::locale::~locale((locale *)&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        argv = local_180;
        if (bVar14) {
          if (local_1bc <= (int)(uint)local_188) {
            piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar8,"Argument parameter missing");
            __cxa_throw(piVar8,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          std::__cxx11::string::string
                    ((string *)&local_1e8,local_180[(int)(uint)local_188],(allocator *)&local_178);
          this = local_38;
          goto LAB_0010b26a;
        }
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"--viewconfig","");
        std::locale::locale((locale *)&local_178);
        pcVar7 = std::use_facet<std::ctype<char>>((locale *)&local_178);
        sVar11 = local_1b8._M_string_length;
        _Var3._M_p = local_1e8._M_dataplus._M_p;
        if (local_1b8._M_string_length == local_1e8._M_string_length) {
          bVar13 = local_1b8._M_string_length == 0;
          if (!bVar13) {
            local_1c8 = (long *)local_1b8._M_dataplus._M_p;
            cVar5 = *local_1e8._M_dataplus._M_p;
            cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)*local_1b8._M_dataplus._M_p);
            cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
            if (cVar4 == cVar5) {
              sVar12 = 1;
              do {
                bVar13 = sVar11 == sVar12;
                if (bVar13) goto LAB_0010ac6e;
                cVar5 = _Var3._M_p[sVar12];
                cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))
                                  (pcVar7,(int)*(char *)((long)local_1c8 + sVar12));
                cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
                sVar12 = sVar12 + 1;
              } while (cVar4 == cVar5);
            }
            goto LAB_0010ac6b;
          }
        }
        else {
LAB_0010ac6b:
          bVar13 = false;
        }
LAB_0010ac6e:
        bVar14 = true;
        if (!bVar13) {
          local_b0 = local_a0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"-vc","");
          std::locale::locale(local_128);
          pcVar7 = std::use_facet<std::ctype<char>>(local_128);
          sVar11 = local_1b8._M_string_length;
          if (local_1b8._M_string_length == local_a8) {
            bVar14 = local_1b8._M_string_length == 0;
            if (bVar14) goto LAB_0010ad5b;
            local_1c8 = (long *)local_1b8._M_dataplus._M_p;
            local_190 = local_b0;
            lVar2 = *local_b0;
            cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)*local_1b8._M_dataplus._M_p);
            cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)(char)lVar2);
            if (cVar5 == cVar4) {
              sVar12 = 1;
              do {
                bVar14 = sVar11 == sVar12;
                if (bVar14) goto LAB_0010ad5b;
                cVar5 = *(char *)((long)local_190 + sVar12);
                cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))
                                  (pcVar7,(int)*(char *)((long)local_1c8 + sVar12));
                cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
                sVar12 = sVar12 + 1;
              } while (cVar4 == cVar5);
            }
          }
          bVar14 = false;
        }
LAB_0010ad5b:
        iVar9 = (int)local_198;
        if ((!bVar13) && (std::locale::~locale(local_128), local_b0 != local_a0)) {
          operator_delete(local_b0,local_a0[0] + 1);
        }
        std::locale::~locale((locale *)&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        argv = local_180;
        if (bVar14) {
          if (local_1bc <= (int)(uint)local_188) {
            piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar8,"Argument parameter missing");
            __cxa_throw(piVar8,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          std::__cxx11::string::string
                    ((string *)&local_1e8,local_180[(int)(uint)local_188],(allocator *)&local_178);
          this = local_40;
          goto LAB_0010b26a;
        }
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"--blendmode","");
        std::locale::locale((locale *)&local_178);
        pcVar7 = std::use_facet<std::ctype<char>>((locale *)&local_178);
        sVar11 = local_1b8._M_string_length;
        _Var3._M_p = local_1e8._M_dataplus._M_p;
        if (local_1b8._M_string_length == local_1e8._M_string_length) {
          bVar13 = local_1b8._M_string_length == 0;
          if (!bVar13) {
            local_1c8 = (long *)local_1b8._M_dataplus._M_p;
            cVar5 = *local_1e8._M_dataplus._M_p;
            cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)*local_1b8._M_dataplus._M_p);
            cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
            if (cVar4 == cVar5) {
              sVar12 = 1;
              do {
                bVar13 = sVar11 == sVar12;
                if (bVar13) goto LAB_0010aeaa;
                cVar5 = _Var3._M_p[sVar12];
                cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))
                                  (pcVar7,(int)*(char *)((long)local_1c8 + sVar12));
                cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
                sVar12 = sVar12 + 1;
              } while (cVar4 == cVar5);
            }
            goto LAB_0010aea7;
          }
        }
        else {
LAB_0010aea7:
          bVar13 = false;
        }
LAB_0010aeaa:
        bVar14 = true;
        if (!bVar13) {
          local_d0 = local_c0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"-bm","");
          std::locale::locale(local_130);
          pcVar7 = std::use_facet<std::ctype<char>>(local_130);
          sVar11 = local_1b8._M_string_length;
          if (local_1b8._M_string_length == local_c8) {
            bVar14 = local_1b8._M_string_length == 0;
            if (bVar14) goto LAB_0010af97;
            local_1c8 = (long *)local_1b8._M_dataplus._M_p;
            local_190 = local_d0;
            lVar2 = *local_d0;
            cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)*local_1b8._M_dataplus._M_p);
            cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)(char)lVar2);
            if (cVar5 == cVar4) {
              sVar12 = 1;
              do {
                bVar14 = sVar11 == sVar12;
                if (bVar14) goto LAB_0010af97;
                cVar5 = *(char *)((long)local_190 + sVar12);
                cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))
                                  (pcVar7,(int)*(char *)((long)local_1c8 + sVar12));
                cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
                sVar12 = sVar12 + 1;
              } while (cVar4 == cVar5);
            }
          }
          bVar14 = false;
        }
LAB_0010af97:
        iVar9 = (int)local_198;
        if ((!bVar13) && (std::locale::~locale(local_130), local_d0 != local_c0)) {
          operator_delete(local_d0,local_c0[0] + 1);
        }
        std::locale::~locale((locale *)&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        argv = local_180;
        if (bVar14) {
          if (local_1bc <= (int)(uint)local_188) {
            piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar8,"Argument parameter missing");
            __cxa_throw(piVar8,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          std::__cxx11::string::string
                    ((string *)&local_1e8,local_180[(int)(uint)local_188],(allocator *)&local_178);
          this = local_48;
          goto LAB_0010b26a;
        }
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"--space","");
        std::locale::locale((locale *)&local_178);
        pcVar7 = std::use_facet<std::ctype<char>>((locale *)&local_178);
        sVar11 = local_1b8._M_string_length;
        _Var3._M_p = local_1e8._M_dataplus._M_p;
        if (local_1b8._M_string_length == local_1e8._M_string_length) {
          bVar13 = local_1b8._M_string_length == 0;
          if (!bVar13) {
            local_1c8 = (long *)local_1b8._M_dataplus._M_p;
            cVar5 = *local_1e8._M_dataplus._M_p;
            cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)*local_1b8._M_dataplus._M_p);
            cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
            if (cVar4 == cVar5) {
              sVar12 = 1;
              do {
                bVar13 = sVar11 == sVar12;
                if (bVar13) goto LAB_0010b0e6;
                cVar5 = _Var3._M_p[sVar12];
                cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))
                                  (pcVar7,(int)*(char *)((long)local_1c8 + sVar12));
                cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
                sVar12 = sVar12 + 1;
              } while (cVar4 == cVar5);
            }
            goto LAB_0010b0e3;
          }
        }
        else {
LAB_0010b0e3:
          bVar13 = false;
        }
LAB_0010b0e6:
        bVar14 = true;
        if (!bVar13) {
          local_f0 = local_e0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"-s","");
          std::locale::locale(local_138);
          pcVar7 = std::use_facet<std::ctype<char>>(local_138);
          sVar11 = local_1b8._M_string_length;
          if (local_1b8._M_string_length == local_e8) {
            bVar14 = local_1b8._M_string_length == 0;
            if (bVar14) goto LAB_0010b1d3;
            local_1c8 = (long *)local_1b8._M_dataplus._M_p;
            local_190 = local_f0;
            lVar2 = *local_f0;
            cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)*local_1b8._M_dataplus._M_p);
            cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)(char)lVar2);
            if (cVar5 == cVar4) {
              sVar12 = 1;
              do {
                bVar14 = sVar11 == sVar12;
                if (bVar14) goto LAB_0010b1d3;
                cVar5 = *(char *)((long)local_190 + sVar12);
                cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))
                                  (pcVar7,(int)*(char *)((long)local_1c8 + sVar12));
                cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
                sVar12 = sVar12 + 1;
              } while (cVar4 == cVar5);
            }
          }
          bVar14 = false;
        }
LAB_0010b1d3:
        iVar9 = (int)local_198;
        if ((!bVar13) && (std::locale::~locale(local_138), local_f0 != local_e0)) {
          operator_delete(local_f0,local_e0[0] + 1);
        }
        std::locale::~locale((locale *)&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        argv = local_180;
        if (bVar14) {
          if (local_1bc <= (int)(uint)local_188) {
            piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar8,"Argument parameter missing");
            __cxa_throw(piVar8,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          std::__cxx11::string::string
                    ((string *)&local_1e8,local_180[(int)(uint)local_188],(allocator *)&local_178);
          this = local_50;
          goto LAB_0010b26a;
        }
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"--verbose","");
        std::locale::locale((locale *)&local_178);
        pcVar7 = std::use_facet<std::ctype<char>>((locale *)&local_178);
        sVar11 = local_1b8._M_string_length;
        _Var3._M_p = local_1e8._M_dataplus._M_p;
        if (local_1b8._M_string_length == local_1e8._M_string_length) {
          bVar13 = local_1b8._M_string_length == 0;
          if (!bVar13) {
            local_198 = (long *)local_1b8._M_dataplus._M_p;
            cVar5 = *local_1e8._M_dataplus._M_p;
            cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)*local_1b8._M_dataplus._M_p);
            cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
            if (cVar4 == cVar5) {
              sVar12 = 1;
              do {
                bVar13 = sVar11 == sVar12;
                if (bVar13) goto LAB_0010b36f;
                cVar5 = _Var3._M_p[sVar12];
                cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))
                                  (pcVar7,(int)*(char *)((long)local_198 + sVar12));
                cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
                sVar12 = sVar12 + 1;
              } while (cVar4 == cVar5);
            }
            goto LAB_0010b36c;
          }
        }
        else {
LAB_0010b36c:
          bVar13 = false;
        }
LAB_0010b36f:
        bVar14 = true;
        if (!bVar13) {
          local_110 = local_100;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"-v","");
          std::locale::locale(local_140);
          pcVar7 = std::use_facet<std::ctype<char>>(local_140);
          sVar11 = local_1b8._M_string_length;
          if (local_1b8._M_string_length == local_108) {
            bVar14 = local_1b8._M_string_length == 0;
            if (bVar14) goto LAB_0010b45e;
            local_198 = (long *)local_1b8._M_dataplus._M_p;
            local_1c8 = local_110;
            lVar2 = *local_110;
            cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)*local_1b8._M_dataplus._M_p);
            cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)(char)lVar2);
            if (cVar5 == cVar4) {
              sVar12 = 1;
              do {
                bVar14 = sVar11 == sVar12;
                if (bVar14) goto LAB_0010b45e;
                cVar5 = *(char *)((long)local_1c8 + sVar12);
                cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))
                                  (pcVar7,(int)*(char *)((long)local_198 + sVar12));
                cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
                sVar12 = sVar12 + 1;
              } while (cVar4 == cVar5);
            }
          }
          bVar14 = false;
        }
LAB_0010b45e:
        if ((!bVar13) && (std::locale::~locale(local_140), local_110 != local_100)) {
          operator_delete(local_110,local_100[0] + 1);
        }
        std::locale::~locale((locale *)&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if (!bVar14) {
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"--help","");
          std::locale::locale(local_148);
          pcVar7 = std::use_facet<std::ctype<char>>(local_148);
          _Var3._M_p = local_1e8._M_dataplus._M_p;
          if (local_1b8._M_string_length != local_1e8._M_string_length) goto LAB_0010b613;
          bVar13 = local_1b8._M_string_length == 0;
          if (bVar13) goto LAB_0010b615;
          local_198 = (long *)local_1b8._M_dataplus._M_p;
          cVar5 = *local_1e8._M_dataplus._M_p;
          cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)*local_1b8._M_dataplus._M_p);
          cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
          if (cVar4 != cVar5) goto LAB_0010b613;
          sVar11 = 1;
          goto LAB_0010b5dc;
        }
        Log::SetLevel(Verbose);
        argv = local_180;
        uVar1 = (uint)local_188;
      }
      plVar10 = (long *)(ulong)uVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
    } while ((int)uVar1 < local_1bc);
  }
  if ((local_158->GraphicsPlugin)._M_string_length == 0) {
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,"GraphicsPlugin parameter is required","");
    Log::Write(Error,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    ShowHelp();
    return false;
  }
  Options::ParseStrings(local_158);
  return true;
  while( true ) {
    cVar5 = _Var3._M_p[sVar11];
    cVar4 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)*(char *)((long)local_198 + sVar11));
    cVar5 = (**(code **)(*(long *)pcVar7 + 0x20))(pcVar7,(int)cVar5);
    sVar11 = sVar11 + 1;
    if (cVar4 != cVar5) break;
LAB_0010b5dc:
    bVar13 = local_1b8._M_string_length == sVar11;
    if (bVar13) goto LAB_0010b615;
  }
LAB_0010b613:
  bVar13 = false;
LAB_0010b615:
  bVar14 = true;
  if (!bVar13) {
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"-h","");
    std::locale::locale(local_150);
    bVar14 = EqualsIgnoreCase(&local_1b8,&local_178,local_150);
    std::locale::~locale(local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
  }
  std::locale::~locale(local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (bVar14 != false) {
    ShowHelp();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
  Fmt_abi_cxx11_(&local_1e8,"Unknown argument: %s",local_1b8._M_dataplus._M_p);
  std::invalid_argument::invalid_argument(piVar8,(string *)&local_1e8);
  __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool UpdateOptionsFromCommandLine(Options& options, int argc, char* argv[]) {
    int i = 1;  // Index 0 is the program name and is skipped.

    auto getNextArg = [&] {
        if (i >= argc) {
            throw std::invalid_argument("Argument parameter missing");
        }

        return std::string(argv[i++]);
    };

    while (i < argc) {
        const std::string arg = getNextArg();
        if (EqualsIgnoreCase(arg, "--graphics") || EqualsIgnoreCase(arg, "-g")) {
            options.GraphicsPlugin = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--formfactor") || EqualsIgnoreCase(arg, "-ff")) {
            options.FormFactor = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--viewconfig") || EqualsIgnoreCase(arg, "-vc")) {
            options.ViewConfiguration = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--blendmode") || EqualsIgnoreCase(arg, "-bm")) {
            options.EnvironmentBlendMode = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--space") || EqualsIgnoreCase(arg, "-s")) {
            options.AppSpace = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--verbose") || EqualsIgnoreCase(arg, "-v")) {
            Log::SetLevel(Log::Level::Verbose);
        } else if (EqualsIgnoreCase(arg, "--help") || EqualsIgnoreCase(arg, "-h")) {
            ShowHelp();
            return false;
        } else {
            throw std::invalid_argument(Fmt("Unknown argument: %s", arg.c_str()));
        }
    }

    // Check for required parameters.
    if (options.GraphicsPlugin.empty()) {
        Log::Write(Log::Level::Error, "GraphicsPlugin parameter is required");
        ShowHelp();
        return false;
    }

    try {
        options.ParseStrings();
    } catch (std::invalid_argument& ia) {
        Log::Write(Log::Level::Error, ia.what());
        ShowHelp();
        return false;
    }
    return true;
}